

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O1

bool __thiscall GameBoard::winConditionSatisfied(GameBoard *this)

{
  QArrayData *pQVar1;
  int iVar2;
  int iVar3;
  reference pQVar4;
  long lVar5;
  bool bVar6;
  QChar *pQVar7;
  QVector<QVector<Field_*>_> *this_00;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QString symbol;
  QArrayData *local_68;
  QChar *local_60;
  longlong lStack_58;
  QArrayData *local_50;
  QChar *local_48;
  long lStack_40;
  
  pQVar1 = local_68;
  iVar3 = this->width_;
  lVar5 = (long)iVar3;
  if (0 < lVar5) {
    lVar11 = 0;
    do {
      pQVar4 = QList<QList<Field_*>_>::operator[](&this->grid_,lVar11);
      QList<Field_*>::operator[](pQVar4,0);
      QAbstractButton::text();
      iVar8 = 1;
      if (iVar3 != 1) {
        lVar10 = 1;
        do {
          pQVar4 = QList<QList<Field_*>_>::operator[](&this->grid_,lVar11);
          QList<Field_*>::operator[](pQVar4,lVar10);
          QAbstractButton::text();
          uVar9 = 0;
          if (lStack_40 == lStack_58) {
            QVar12.m_data = &local_60->ucs;
            QVar12.m_size = lStack_58;
            QVar16.m_data = &local_48->ucs;
            QVar16.m_size = lStack_40;
            iVar2 = QtPrivate::compareStrings(QVar16,QVar12,CaseSensitive);
            uVar9 = (uint)(iVar2 == 0);
          }
          if (local_50 != (QArrayData *)0x0) {
            LOCK();
            (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50,2,8);
            }
          }
          iVar8 = iVar8 + uVar9;
          lVar10 = lVar10 + 1;
        } while (lVar5 != lVar10);
      }
      if (iVar8 == iVar3) {
        pQVar7 = local_60;
        if (local_60 == (QChar *)0x0) {
          pQVar7 = (QChar *)&QString::_empty;
        }
        iVar8 = QString::compare_helper(pQVar7,lStack_58,"",-1,CaseSensitive);
        if (iVar8 != 0) goto LAB_00109018;
      }
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68,2,8);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar5);
  }
  if (0 < iVar3) {
    lVar11 = 0;
    do {
      pQVar4 = QList<QList<Field_*>_>::operator[](&this->grid_,0);
      QList<Field_*>::operator[](pQVar4,lVar11);
      QAbstractButton::text();
      iVar8 = 1;
      if (iVar3 != 1) {
        lVar10 = 1;
        do {
          pQVar4 = QList<QList<Field_*>_>::operator[](&this->grid_,lVar10);
          QList<Field_*>::operator[](pQVar4,lVar11);
          QAbstractButton::text();
          uVar9 = 0;
          if (lStack_40 == lStack_58) {
            QVar13.m_data = &local_60->ucs;
            QVar13.m_size = lStack_58;
            QVar17.m_data = &local_48->ucs;
            QVar17.m_size = lStack_40;
            iVar2 = QtPrivate::compareStrings(QVar17,QVar13,CaseSensitive);
            uVar9 = (uint)(iVar2 == 0);
          }
          if (local_50 != (QArrayData *)0x0) {
            LOCK();
            (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50,2,8);
            }
          }
          iVar8 = iVar8 + uVar9;
          lVar10 = lVar10 + 1;
        } while (lVar5 != lVar10);
      }
      if (iVar8 == iVar3) {
        pQVar7 = local_60;
        if (local_60 == (QChar *)0x0) {
          pQVar7 = (QChar *)&QString::_empty;
        }
        iVar8 = QString::compare_helper(pQVar7,lStack_58,"",-1,CaseSensitive);
        if (iVar8 != 0) {
LAB_00109018:
          if (local_68 != (QArrayData *)0x0) {
            LOCK();
            (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_68,2,8);
            }
          }
          return true;
        }
      }
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68,2,8);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar5);
  }
  this_00 = &this->grid_;
  pQVar4 = QList<QList<Field_*>_>::operator[](this_00,0);
  QList<Field_*>::operator[](pQVar4,0);
  QAbstractButton::text();
  iVar8 = 1;
  if (1 < iVar3) {
    lVar11 = 1;
    do {
      pQVar4 = QList<QList<Field_*>_>::operator[](this_00,lVar11);
      QList<Field_*>::operator[](pQVar4,lVar11);
      QAbstractButton::text();
      uVar9 = 0;
      if (lStack_40 == lStack_58) {
        QVar14.m_data = &local_60->ucs;
        QVar14.m_size = lStack_58;
        QVar18.m_data = &local_48->ucs;
        QVar18.m_size = lStack_40;
        iVar2 = QtPrivate::compareStrings(QVar18,QVar14,CaseSensitive);
        uVar9 = (uint)(iVar2 == 0);
      }
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,8);
        }
      }
      iVar8 = iVar8 + uVar9;
      lVar11 = lVar11 + 1;
    } while (lVar5 != lVar11);
  }
  if (iVar8 == iVar3) {
    pQVar7 = local_60;
    if (local_60 == (QChar *)0x0) {
      pQVar7 = (QChar *)&QString::_empty;
    }
    iVar8 = QString::compare_helper(pQVar7,lStack_58,"",-1,CaseSensitive);
    bVar6 = true;
    if (iVar8 != 0) goto LAB_00108ff5;
  }
  pQVar4 = QList<QList<Field_*>_>::operator[](this_00,lVar5 + -1);
  QList<Field_*>::operator[](pQVar4,0);
  QAbstractButton::text();
  local_68 = local_50;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  iVar8 = 1;
  if (1 < iVar3) {
    lVar11 = lVar5 + -2;
    lVar10 = 1;
    do {
      pQVar4 = QList<QList<Field_*>_>::operator[](this_00,lVar11);
      QList<Field_*>::operator[](pQVar4,lVar10);
      QAbstractButton::text();
      uVar9 = 0;
      if (lStack_58 == lStack_40) {
        QVar15.m_data = &local_48->ucs;
        QVar15.m_size = lStack_40;
        QVar19.m_data = &local_60->ucs;
        QVar19.m_size = lStack_58;
        iVar2 = QtPrivate::compareStrings(QVar19,QVar15,CaseSensitive);
        uVar9 = (uint)(iVar2 == 0);
      }
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
      iVar8 = iVar8 + uVar9;
      lVar11 = lVar11 + -1;
      lVar10 = lVar10 + 1;
    } while (lVar5 != lVar10);
  }
  if (iVar8 == iVar3) {
    if (local_48 == (QChar *)0x0) {
      local_48 = (QChar *)&QString::_empty;
    }
    iVar3 = QString::compare_helper(local_48,lStack_40,"",-1,CaseSensitive);
    bVar6 = true;
    if (iVar3 != 0) goto LAB_00108ff5;
  }
  bVar6 = false;
LAB_00108ff5:
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  return bVar6;
}

Assistant:

bool GameBoard::winConditionSatisfied()
{
    // Check horizontally
    int N = width_; //Our application only works with square maps
    for(int i = 0; i < N; i++)
    {
        int matches = 1; // first symbol matches itself
        QString symbol = grid_[i][0]->text(); //Check if field holds X, O or is blank
        for(int j = 1; j < N; j++)
        {
            if(grid_[i][j]->text() == symbol)
                matches++;
        }
        if(matches == N && symbol != "")
            return true;
    }

    //Check vertically
    for(int j = 0; j < N; j++)
    {
        int matches = 1; // first symbol matches itself
        QString symbol = grid_[0][j]->text(); //Check if field holds X, O or is blank
        for(int i = 1; i < N; i++)
        {
            if(grid_[i][j]->text() == symbol)
                matches++;
        }
        if(matches == N && symbol != "")
            return true;
    }

    //Check diagonally
    //First check top left to bottom right:
    QString symbol = grid_[0][0]->text();
    int matches = 1;
    for(int i = 1; i < N; i++)
    {
        if(grid_[i][i]->text() == symbol)
            matches++;
    }
    if(matches == N && symbol != "")
        return true;

    //check bottom left to top right
    matches = 1;
    symbol = grid_[N-1][0]->text();
    for(int i = N-2, j = 1; j < N; i--, j++)
    {
        if(grid_[i][j]->text() == symbol)
            matches++;
    }
    if(matches == N && symbol != "")
        return true;

    return false; // If none of the previous checks returned true, win condition is not satisfied
}